

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O2

void ecs_notify_tables(ecs_world_t *world,ecs_table_event_t *event)

{
  ecs_sparse_t *sparse;
  int32_t iVar1;
  ecs_table_t *table;
  int dense_index;
  
  sparse = (world->store).tables;
  iVar1 = ecs_sparse_count(sparse);
  dense_index = 0;
  if (iVar1 < 1) {
    iVar1 = dense_index;
  }
  for (; iVar1 != dense_index; dense_index = dense_index + 1) {
    table = (ecs_table_t *)_ecs_sparse_get(sparse,0x80,dense_index);
    ecs_table_notify(world,table,event);
  }
  return;
}

Assistant:

void ecs_notify_tables(
    ecs_world_t *world,
    ecs_table_event_t *event)
{
    ecs_sparse_t *tables = world->store.tables;
    int32_t i, count = ecs_sparse_count(tables);

    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(tables, ecs_table_t, i);
        ecs_table_notify(world, table, event);
    }
}